

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O2

bool __thiscall
re2::SparseArray<re2::NFA::Thread_*>::has_index(SparseArray<re2::NFA::Thread_*> *this,int i)

{
  bool bVar1;
  
  if (i < 0) {
    __assert_fail("(i) >= (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x134,
                  "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                 );
  }
  if (i < this->max_size_) {
    if ((uint)this->sparse_to_dense_[(uint)i] < (uint)this->size_) {
      bVar1 = (this->dense_).
              super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
              ._M_impl.super__Vector_impl_data._M_start[this->sparse_to_dense_[(uint)i]].index_ == i
      ;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  __assert_fail("(i) < (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x135,
                "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
               );
}

Assistant:

bool SparseArray<Value>::has_index(int i) const {
  DCHECK_GE(i, 0);
  DCHECK_LT(i, max_size_);
  if (static_cast<uint>(i) >= static_cast<uint>(max_size_)) {
    return false;
  }
  // Unsigned comparison avoids checking sparse_to_dense_[i] < 0.
  return (uint)sparse_to_dense_[i] < (uint)size_ && 
    dense_[sparse_to_dense_[i]].index_ == i;
}